

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall r_code::list<r_exec::Input>::push_back_free_cell(list<r_exec::Input> *this,Input *t)

{
  long lVar1;
  pointer pcVar2;
  
  lVar1 = this->free_cells;
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar1;
  this->free_cells = pcVar2->next;
  this->free_cell_count = this->free_cell_count - 1;
  r_exec::Input::operator=(&pcVar2->data,t);
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2[lVar1].next = -1;
  pcVar2[lVar1].prev = this->used_cells_tail;
  this->used_cells_tail = lVar1;
  return;
}

Assistant:

void push_back_free_cell(const T &t)
    {
        int64_t free = free_cells;
        free_cells = cells[free_cells].next;
        --free_cell_count;
        cells[free].data = t;
        cells[free].next = null;
        cells[free].prev = used_cells_tail;
        used_cells_tail = free;
    }